

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O0

float get_long_short_ratio_y(void)

{
  int iVar1;
  Am_Value *pAVar2;
  Am_Object local_18;
  int local_c;
  int max_short_y;
  int max_long_y;
  
  pAVar2 = (Am_Value *)Am_Object::Get(0x33e8,0x67);
  iVar1 = Am_Value::operator_cast_to_int(pAVar2);
  pAVar2 = (Am_Value *)Am_Object::Get(0x3428,0x67);
  local_c = Am_Value::operator_cast_to_int(pAVar2);
  local_c = iVar1 - local_c;
  Am_Object::Get_Object((ushort)&local_18,0x1133d8);
  pAVar2 = (Am_Value *)Am_Object::Get((ushort)&local_18,0x182);
  iVar1 = Am_Value::operator_cast_to_int(pAVar2);
  Am_Object::~Am_Object(&local_18);
  return (float)local_c / (float)iVar1;
}

Assistant:

float
get_long_short_ratio_y()
{
  int max_long_y =
      (int)(SP_Long_Win.Get(Am_HEIGHT)) - (int)(SP_Long_Feed.Get(Am_HEIGHT));
  int max_short_y = SP_Scroll_Agg.Get_Object(Am_V_SCROLLER).Get(Am_VALUE_2);
  return ((float)max_long_y / max_short_y);
}